

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<double>_>::Substitution(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  int i;
  uint uVar8;
  ulong uVar9;
  int i_1;
  long lVar10;
  int sz;
  Fad<double> local_128;
  long local_108;
  int64_t local_100;
  long local_f8;
  TPZMatrix<Fad<double>_> *local_f0;
  Fad<double> local_e8;
  Fad<double> local_c8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_a8;
  FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_> local_98;
  Fad<double> local_88;
  double local_68;
  undefined8 uStack_60;
  Fad<double> local_50;
  
  local_108 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_100 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  local_f0 = this;
  if (local_108 != (this->super_TPZBaseMatrix).fRow) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  if (0 < local_108) {
    lVar6 = 0;
    do {
      if (0 < local_100) {
        lVar4 = 0;
        local_f8 = lVar6;
        do {
          if (lVar6 != 0) {
            lVar10 = 0;
            do {
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_c8,B,lVar6,lVar4);
              (*(local_f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_e8,local_f0,lVar6,lVar10);
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_88,B,lVar10,lVar4);
              local_a8.fadexpr_.left_ = &local_e8;
              local_98.left_ = &local_c8;
              local_98.right_ = &local_a8;
              local_128.val_ = local_c8.val_ - local_e8.val_ * local_88.val_;
              uVar8 = local_88.dx_.num_elts;
              if (local_88.dx_.num_elts < local_e8.dx_.num_elts) {
                uVar8 = local_e8.dx_.num_elts;
              }
              if ((int)uVar8 < local_c8.dx_.num_elts) {
                uVar8 = local_c8.dx_.num_elts;
              }
              local_128.dx_.num_elts = 0;
              local_128.dx_.ptr_to_data = (double *)0x0;
              local_a8.fadexpr_.right_ = &local_88;
              if ((int)uVar8 < 1) {
                local_128.defaultVal = 0.0;
                lVar6 = local_f8;
              }
              else {
                local_128.dx_.num_elts = uVar8;
                local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar8 * 8);
                lVar6 = local_f8;
                local_128.defaultVal = 0.0;
                if (0 < (int)uVar8) {
                  uVar9 = 0;
                  do {
                    vVar1 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                            ::dx(&local_98,(int)uVar9);
                    local_128.dx_.ptr_to_data[uVar9] = vVar1;
                    uVar9 = uVar9 + 1;
                  } while (uVar8 != uVar9);
                }
              }
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x23])(B,lVar6,lVar4,&local_128);
              Fad<double>::~Fad(&local_128);
              Fad<double>::~Fad(&local_88);
              Fad<double>::~Fad(&local_e8);
              Fad<double>::~Fad(&local_c8);
              lVar10 = lVar10 + 1;
            } while (lVar10 != lVar6);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != local_100);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_108);
  }
  if (0 < local_100) {
    lVar6 = 0;
    do {
      lVar4 = local_108;
      if (0 < local_108) {
        do {
          lVar10 = lVar4 + -1;
          local_f8 = lVar4;
          if (lVar4 < local_108) {
            do {
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_c8,B,lVar10,lVar6);
              (*(local_f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_e8,local_f0,lVar10,lVar4);
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_88,B,lVar4,lVar6);
              local_a8.fadexpr_.left_ = &local_e8;
              local_98.left_ = &local_c8;
              local_98.right_ = &local_a8;
              local_128.val_ = local_c8.val_ - local_e8.val_ * local_88.val_;
              uVar8 = local_88.dx_.num_elts;
              if (local_88.dx_.num_elts < local_e8.dx_.num_elts) {
                uVar8 = local_e8.dx_.num_elts;
              }
              if ((int)uVar8 < local_c8.dx_.num_elts) {
                uVar8 = local_c8.dx_.num_elts;
              }
              local_128.dx_.num_elts = 0;
              local_128.dx_.ptr_to_data = (double *)0x0;
              local_a8.fadexpr_.right_ = &local_88;
              if ((int)uVar8 < 1) {
                local_128.defaultVal = 0.0;
              }
              else {
                local_128.dx_.num_elts = uVar8;
                local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar8 * 8);
                local_128.defaultVal = 0.0;
                if (0 < (int)uVar8) {
                  uVar9 = 0;
                  do {
                    vVar1 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                            ::dx(&local_98,(int)uVar9);
                    local_128.dx_.ptr_to_data[uVar9] = vVar1;
                    uVar9 = uVar9 + 1;
                  } while (uVar8 != uVar9);
                }
              }
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x23])(B,lVar10,lVar6,&local_128);
              Fad<double>::~Fad(&local_128);
              Fad<double>::~Fad(&local_88);
              Fad<double>::~Fad(&local_e8);
              Fad<double>::~Fad(&local_c8);
              lVar4 = lVar4 + 1;
            } while (lVar4 != local_108);
          }
          (*(local_f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,local_f0,lVar10,lVar10);
          local_68 = ABS(local_50.val_);
          uStack_60 = 0;
          Fad<double>::~Fad(&local_50);
          if (local_68 < 1e-12) {
            Error("BackSub( SubstitutionLU ) <Matrix is singular",(char *)0x0);
          }
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_c8,B,lVar10,lVar6);
          (*(local_f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_e8,local_f0,lVar10);
          iVar3 = local_c8.dx_.num_elts;
          iVar2 = local_e8.dx_.num_elts;
          local_128.val_ = local_c8.val_ / local_e8.val_;
          uVar8 = local_e8.dx_.num_elts;
          if (local_e8.dx_.num_elts < local_c8.dx_.num_elts) {
            uVar8 = local_c8.dx_.num_elts;
          }
          local_128.dx_.num_elts = 0;
          local_128.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar8) {
            local_68 = (double)CONCAT44(local_68._4_4_,uVar8);
            uVar9 = (ulong)uVar8;
            local_128.dx_.num_elts = uVar8;
            local_128.dx_.ptr_to_data = (double *)operator_new__(uVar9 * 8);
            if (0 < local_68._0_4_) {
              lVar4 = 0;
              do {
                pdVar5 = (double *)((long)local_c8.dx_.ptr_to_data + lVar4);
                if (iVar3 == 0) {
                  pdVar5 = &local_c8.defaultVal;
                }
                pdVar7 = (double *)((long)local_e8.dx_.ptr_to_data + lVar4);
                if (iVar2 == 0) {
                  pdVar7 = &local_e8.defaultVal;
                }
                *(double *)((long)local_128.dx_.ptr_to_data + lVar4) =
                     (*pdVar5 * local_e8.val_ - local_c8.val_ * *pdVar7) /
                     (local_e8.val_ * local_e8.val_);
                lVar4 = lVar4 + 8;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
          local_128.defaultVal = 0.0;
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(B,lVar10,lVar6,&local_128);
          Fad<double>::~Fad(&local_128);
          Fad<double>::~Fad(&local_e8);
          Fad<double>::~Fad(&local_c8);
          lVar4 = lVar10;
        } while (1 < local_f8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_100);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const{
	
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    if ( rowb != Rows() )
		Error( "SubstitutionLU <incompatible dimensions>" );
	int64_t i;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ ) {
            for ( int64_t j = 0; j < i; j++ ) {
                B->PutVal( i, col, B->GetVal(i, col)-GetVal(i, j) * B->GetVal(j, col) );
            }
        }
    }
    for (int64_t col=0; col<colb; col++) {
        for ( i = rowb-1; i >= 0; i-- ) {
            for ( int64_t j = i+1; j < rowb ; j++ ) {
                B->PutVal( i, col, B->GetVal(i, col) -
						  GetVal(i, j) * B->GetVal(j, col) );
            }
            if ( IsZero( GetVal(i, i) ) ) {
				Error( "BackSub( SubstitutionLU ) <Matrix is singular" );
            }
            B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
		}
    }
    return( 1 );
}